

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O0

void __kmpc_omp_task_begin_if0_template<true>
               (ident_t *loc_ref,kmp_int32 gtid,kmp_task_t *task,void *frame_address,
               void *return_address)

{
  kmp_taskdata_t *current_task_00;
  uint uVar1;
  ompt_data_t in_RCX;
  kmp_task_t *in_RDX;
  int in_ESI;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *in_R8;
  bool bVar5;
  ompt_task_info_t *parent_info;
  kmp_int32 counter;
  kmp_taskdata_t *current_task;
  kmp_taskdata_t *taskdata;
  ompt_data_t *in_stack_ffffffffffffff70;
  kmp_taskdata_t *in_stack_ffffffffffffff78;
  ompt_data_t *in_stack_ffffffffffffff80;
  
  current_task_00 = (__kmp_threads[in_ESI]->th).th_current_task;
  if (((ulong)in_RDX[-7].data1.destructors & 0x100000000) == 0) {
    LOCK();
    *(int *)&in_RDX[-6].field_0x14 = *(int *)&in_RDX[-6].field_0x14 + 1;
    UNLOCK();
  }
  *(uint *)((long)&in_RDX[-7].data1 + 4) =
       *(uint *)((long)&in_RDX[-7].data1 + 4) & 0xfffdffff | 0x20000;
  __kmp_task_start(in_ESI,in_RDX,current_task_00);
  if ((current_task_00->ompt_task_info).frame.enter_frame.value == 0) {
    *(ompt_data_t *)&in_RDX[-2].part_id = in_RCX;
    (current_task_00->ompt_task_info).frame.enter_frame = in_RCX;
    in_RDX[-2].data2.priority = 0x21;
    (current_task_00->ompt_task_info).frame.enter_frame_flags = 0x21;
  }
  if (((ulong)ompt_enabled >> 5 & 1) != 0) {
    in_stack_ffffffffffffff78 = (kmp_taskdata_t *)&current_task_00->ompt_task_info;
    in_stack_ffffffffffffff70 = &(current_task_00->ompt_task_info).task_data;
    in_stack_ffffffffffffff80 = (ompt_data_t *)(in_RDX + -1);
    bVar5 = true;
    if ((*(uint *)((long)&in_RDX[-7].data1 + 4) >> 0x11 & 1) == 0) {
      bVar5 = (*(uint *)((long)&in_RDX[-7].data1 + 4) >> 0x12 & 1) != 0;
    }
    uVar1 = 0;
    if (bVar5) {
      uVar1 = 0x8000000;
    }
    uVar2 = 0;
    if (((ulong)in_RDX[-7].data1.destructors & 0x100000000) == 0) {
      uVar2 = 0x10000000;
    }
    uVar3 = 0;
    if ((*(uint *)((long)&in_RDX[-7].data1 + 4) >> 1 & 1) != 0) {
      uVar3 = 0x20000000;
    }
    uVar4 = 0;
    if ((*(uint *)((long)&in_RDX[-7].data1 + 4) >> 2 & 1) != 0) {
      uVar4 = 0x40000000;
    }
    (*ompt_callbacks.ompt_callback_task_create_callback)
              (in_stack_ffffffffffffff70,(ompt_frame_t *)in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff80,uVar1 | 4 | uVar2 | uVar3 | uVar4,0,in_R8);
  }
  __ompt_task_start((kmp_task_t *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                    (kmp_int32)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  return;
}

Assistant:

static void __kmpc_omp_task_begin_if0_template(ident_t *loc_ref, kmp_int32 gtid,
                                               kmp_task_t *task,
                                               void *frame_address,
                                               void *return_address) {
  kmp_taskdata_t *taskdata = KMP_TASK_TO_TASKDATA(task);
  kmp_taskdata_t *current_task = __kmp_threads[gtid]->th.th_current_task;

  KA_TRACE(10, ("__kmpc_omp_task_begin_if0(enter): T#%d loc=%p task=%p "
                "current_task=%p\n",
                gtid, loc_ref, taskdata, current_task));

  if (taskdata->td_flags.tiedness == TASK_UNTIED) {
    // untied task needs to increment counter so that the task structure is not
    // freed prematurely
    kmp_int32 counter = 1 + KMP_ATOMIC_INC(&taskdata->td_untied_count);
    KMP_DEBUG_USE_VAR(counter);
    KA_TRACE(20, ("__kmpc_omp_task_begin_if0: T#%d untied_count (%d) "
                  "incremented for task %p\n",
                  gtid, counter, taskdata));
  }

  taskdata->td_flags.task_serial =
      1; // Execute this task immediately, not deferred.
  __kmp_task_start(gtid, task, current_task);

#if OMPT_SUPPORT
  if (ompt) {
    if (current_task->ompt_task_info.frame.enter_frame.ptr == NULL) {
      current_task->ompt_task_info.frame.enter_frame.ptr =
          taskdata->ompt_task_info.frame.exit_frame.ptr = frame_address;
      current_task->ompt_task_info.frame.enter_frame_flags =
          taskdata->ompt_task_info.frame.exit_frame_flags = ompt_frame_application | ompt_frame_framepointer;
    }
    if (ompt_enabled.ompt_callback_task_create) {
      ompt_task_info_t *parent_info = &(current_task->ompt_task_info);
      ompt_callbacks.ompt_callback(ompt_callback_task_create)(
          &(parent_info->task_data), &(parent_info->frame),
          &(taskdata->ompt_task_info.task_data),
          ompt_task_explicit | TASK_TYPE_DETAILS_FORMAT(taskdata), 0,
          return_address);
    }
    __ompt_task_start(task, current_task, gtid);
  }
#endif // OMPT_SUPPORT

  KA_TRACE(10, ("__kmpc_omp_task_begin_if0(exit): T#%d loc=%p task=%p,\n", gtid,
                loc_ref, taskdata));
}